

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

bool __thiscall kj::_::NetworkFilter::shouldAllow(NetworkFilter *this,sockaddr *addr,uint addrlen)

{
  RemoveConst<kj::CidrRange> *pRVar1;
  NetworkFilter *pNVar2;
  bool bVar3;
  bool bVar4;
  undefined1 uVar5;
  int iVar6;
  long lVar7;
  CidrRange *pCVar8;
  uint uVar9;
  CidrRange *cidr;
  ArrayPtr<const_char> AVar10;
  ArrayPtr<const_kj::CidrRange> AVar11;
  Fault f;
  DebugComparison<unsigned_int_&,_unsigned_long> _kjCondition;
  uint local_64;
  Fault local_60;
  DebugComparison<unsigned_int_&,_unsigned_long> local_58;
  
  local_58.left = &local_64;
  local_58.result = addrlen >= 2;
  local_58.right = 2;
  local_58.op.content.ptr = " >= ";
  local_58.op.content.size_ = 5;
  local_64 = addrlen;
  if (addrlen < 2) {
    Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&>
              (&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xc39,FAILED,"addrlen >= sizeof(addr->sa_family)","_kjCondition,",&local_58);
    Debug::Fault::fatal(&local_60);
  }
  if (addr->sa_family == 1) {
    AVar10 = safeUnixPath((sockaddr_un *)addr,addrlen);
    if ((AVar10.size_ == 0) || (*AVar10.ptr != '\0')) {
      lVar7 = 0x48;
    }
    else {
      lVar7 = 0x49;
    }
    uVar5 = *(undefined1 *)((long)&(this->super_NetworkFilter)._vptr_NetworkFilter + lVar7);
  }
  else {
    if ((this->allowPublic == true) && ((addr->sa_family | 8) == 10)) {
      AVar11 = privateCidrs();
      pCVar8 = AVar11.ptr;
      if (AVar11.size_ != 0) {
        lVar7 = AVar11.size_ * 0x18;
        do {
          bVar3 = CidrRange::matches(pCVar8,addr);
          if (bVar3) goto LAB_00409cd7;
          pCVar8 = pCVar8 + 1;
          lVar7 = lVar7 + -0x18;
        } while (lVar7 != 0);
      }
      AVar11 = localCidrs();
      pCVar8 = AVar11.ptr;
      if (AVar11.size_ != 0) {
        lVar7 = AVar11.size_ * 0x18;
        do {
          bVar3 = CidrRange::matches(pCVar8,addr);
          if (bVar3) goto LAB_00409cd7;
          pCVar8 = pCVar8 + 1;
          lVar7 = lVar7 + -0x18;
        } while (lVar7 != 0);
      }
      AVar11 = reservedCidrs();
      pCVar8 = AVar11.ptr;
      if (AVar11.size_ == 0) {
        bVar3 = true;
      }
      else {
        lVar7 = AVar11.size_ * 0x18;
        do {
          lVar7 = lVar7 + -0x18;
          bVar3 = CidrRange::matches(pCVar8,addr);
          if (bVar3) break;
          pCVar8 = pCVar8 + 1;
        } while (lVar7 != 0);
        bVar3 = !bVar3;
      }
    }
    else {
LAB_00409cd7:
      bVar3 = false;
    }
    if ((this->allowNetwork == true) && ((addr->sa_family | 8) == 10)) {
      AVar11 = localCidrs();
      pCVar8 = AVar11.ptr;
      if (AVar11.size_ != 0) {
        lVar7 = AVar11.size_ * 0x18;
        do {
          bVar4 = CidrRange::matches(pCVar8,addr);
          if (bVar4) goto LAB_00409d4a;
          pCVar8 = pCVar8 + 1;
          lVar7 = lVar7 + -0x18;
        } while (lVar7 != 0);
      }
      AVar11 = reservedCidrs();
      pCVar8 = AVar11.ptr;
      if (AVar11.size_ != 0) {
        lVar7 = AVar11.size_ * 0x18;
        do {
          bVar4 = CidrRange::matches(pCVar8,addr);
          if (bVar4) goto LAB_00409d4a;
          pCVar8 = pCVar8 + 1;
          lVar7 = lVar7 + -0x18;
        } while (lVar7 != 0);
      }
      bVar3 = true;
    }
LAB_00409d4a:
    pRVar1 = (this->allowCidrs).builder.pos;
    uVar9 = 0;
    for (pCVar8 = (this->allowCidrs).builder.ptr; pCVar8 != pRVar1; pCVar8 = pCVar8 + 1) {
      bVar4 = CidrRange::matches(pCVar8,addr);
      if (bVar4) {
        if (uVar9 <= pCVar8->bitCount) {
          uVar9 = pCVar8->bitCount;
        }
        bVar3 = true;
      }
    }
    if (bVar3) {
      pRVar1 = (this->denyCidrs).builder.pos;
      for (pCVar8 = (this->denyCidrs).builder.ptr; pCVar8 != pRVar1; pCVar8 = pCVar8 + 1) {
        bVar3 = CidrRange::matches(pCVar8,addr);
        if ((bVar3) && (uVar9 <= pCVar8->bitCount)) goto LAB_00409dab;
      }
      pNVar2 = (this->next).ptr;
      if (pNVar2 == (NetworkFilter *)0x0) {
        uVar5 = 1;
      }
      else {
        iVar6 = (**(pNVar2->super_NetworkFilter)._vptr_NetworkFilter)(pNVar2,addr,(ulong)local_64);
        uVar5 = (undefined1)iVar6;
      }
    }
    else {
LAB_00409dab:
      uVar5 = 0;
    }
  }
  return (bool)uVar5;
}

Assistant:

bool NetworkFilter::shouldAllow(const struct sockaddr* addr, uint addrlen) {
  KJ_REQUIRE(addrlen >= sizeof(addr->sa_family));

#if !_WIN32
  if (addr->sa_family == AF_UNIX) {
    auto path = safeUnixPath(reinterpret_cast<const struct sockaddr_un*>(addr), addrlen);
    if (path.size() > 0 && path[0] == '\0') {
      return allowAbstractUnix;
    } else {
      return allowUnix;
    }
  }
#endif

  bool allowed = false;
  uint allowSpecificity = 0;

  if (allowPublic) {
    if ((addr->sa_family == AF_INET || addr->sa_family == AF_INET6) &&
        !matchesAny(privateCidrs(), addr) &&
        !matchesAny(localCidrs(), addr) &&
        !matchesAny(reservedCidrs(), addr)) {
      allowed = true;
      // Don't adjust allowSpecificity as this match has an effective specificity of zero.
    }
  }

  if (allowNetwork) {
    if ((addr->sa_family == AF_INET || addr->sa_family == AF_INET6) &&
        !matchesAny(localCidrs(), addr) &&
        !matchesAny(reservedCidrs(), addr)) {
      allowed = true;
      // Don't adjust allowSpecificity as this match has an effective specificity of zero.
    }
  }

  for (auto& cidr: allowCidrs) {
    if (cidr.matches(addr)) {
      allowSpecificity = kj::max(allowSpecificity, cidr.getSpecificity());
      allowed = true;
    }
  }
  if (!allowed) return false;
  for (auto& cidr: denyCidrs) {
    if (cidr.matches(addr)) {
      if (cidr.getSpecificity() >= allowSpecificity) return false;
    }
  }

  KJ_IF_SOME(n, next) {
    return n.shouldAllow(addr, addrlen);
  } else {
    return true;
  }
}